

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# askf_tx3.cpp
# Opt level: O1

int __thiscall
CVmConsole::askfile(CVmConsole *this,char *prompt,size_t prompt_len,char *reply,size_t replen,
                   int param_5,os_filetype_t param_6,int bypass_script)

{
  int iVar1;
  int iVar2;
  
  (*this->_vptr_CVmConsole[1])();
  (*this->_vptr_CVmConsole[1])(this," >",2);
  iVar1 = read_line(this,reply,replen,bypass_script);
  iVar2 = 1;
  if (iVar1 == 0) {
    iVar2 = (uint)(*reply == '\0') * 2;
  }
  return iVar2;
}

Assistant:

int CVmConsole::askfile(VMG_ const char *prompt, size_t prompt_len,
                        char *reply, size_t replen,
                        int /*dialog_type*/, os_filetype_t /*file_type*/,
                        int bypass_script)
{
    /* show the prompt */
    format_text(vmg_ prompt, prompt_len);
    format_text(vmg_ " >");

    /* ask for the filename */
    if (read_line(vmg_ reply, replen, bypass_script))
        return OS_AFE_FAILURE;

    /* 
     *   if they entered an empty line, return "cancel"; otherwise, return
     *   success 
     */
    return (reply[0] == '\0' ? OS_AFE_CANCEL : OS_AFE_SUCCESS);
}